

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

CommandInfo * findCommandByName(String *fname)

{
  CommandInfo *this;
  _Elt_pointer ppCVar1;
  __type _Var2;
  _Elt_pointer ppCVar3;
  _Map_pointer local_88;
  _Elt_pointer local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppCVar1 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  local_80 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
  local_88 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppCVar3 = Commands._deque.super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
  while( true ) {
    if (ppCVar3 == ppCVar1) {
      return (CommandInfo *)0x0;
    }
    this = *ppCVar3;
    String::toUppercase((String *)&local_70,fname);
    String::toUppercase((String *)&local_50,&this->name);
    _Var2 = std::operator==(&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) break;
    ppCVar3 = ppCVar3 + 1;
    if (ppCVar3 == local_80) {
      ppCVar3 = local_88[1];
      local_88 = local_88 + 1;
      local_80 = ppCVar3 + 0x40;
    }
  }
  return this;
}

Assistant:

CommandInfo* findCommandByName (String fname)
{
	for (CommandInfo* comm : Commands)
	{
		if (fname.toUppercase() == comm->name.toUppercase())
			return comm;
	}

	return null;
}